

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O2

int FirewirePort::reset_handler(raw1394handle_t hdl,uint gen)

{
  ostream *poVar1;
  pointer ppFVar2;
  
  ppFVar2 = PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppFVar2 ==
        PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00111dde:
      poVar1 = std::operator<<((ostream *)&std::cerr,
                               "FirewirePort::reset_handler: could not find port");
      std::endl<char,std::char_traits<char>>(poVar1);
      return 0;
    }
    if ((*ppFVar2)->handle == hdl) {
      poVar1 = std::operator<<(((*ppFVar2)->super_BasePort).outStr,
                               "FirewirePort::reset_handler: generation = ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      ((*ppFVar2)->super_BasePort).newFwBusGeneration = gen;
      if (ppFVar2 !=
          PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return 0;
      }
      goto LAB_00111dde;
    }
    ppFVar2 = ppFVar2 + 1;
  } while( true );
}

Assistant:

int FirewirePort::reset_handler(raw1394handle_t hdl, uint gen)
{
    int ret = 0;
    PortListType::iterator it;
    for (it = PortList.begin(); it != PortList.end(); it++) {
        if ((*it)->handle == hdl) {
            (*it)->outStr << "FirewirePort::reset_handler: generation = " << gen << std::endl;
            // Call default handler, which calls raw1394_update_generation
            // ret = (*it)->old_reset_handler(hdl, gen);
            (*it)->newFwBusGeneration = gen;
            break;
        }
    }
    if (it == PortList.end())
        std::cerr << "FirewirePort::reset_handler: could not find port" << std::endl;
    return ret;
}